

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindLocalNonAliasGeneratorTarget(cmLocalGenerator *this,string *name)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_70 [3];
  NamedGeneratorTargetFinder local_58;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_38;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_30;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_28;
  const_iterator ti;
  string *name_local;
  cmLocalGenerator *this_local;
  
  ti._M_current = (cmGeneratorTarget **)name;
  local_30._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 (&this->GeneratorTargets);
  local_38._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                 (&this->GeneratorTargets);
  NamedGeneratorTargetFinder::NamedGeneratorTargetFinder(&local_58,(string *)ti._M_current);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                       (local_30,local_38,&local_58);
  NamedGeneratorTargetFinder::~NamedGeneratorTargetFinder(&local_58);
  local_70[0]._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                 (&this->GeneratorTargets);
  bVar1 = __gnu_cxx::operator!=(&local_28,local_70);
  if (bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_28);
    this_local = (cmLocalGenerator *)*ppcVar2;
  }
  else {
    this_local = (cmLocalGenerator *)0x0;
  }
  return (cmGeneratorTarget *)this_local;
}

Assistant:

cmGeneratorTarget* cmLocalGenerator::FindLocalNonAliasGeneratorTarget(
  const std::string& name) const
{
  std::vector<cmGeneratorTarget*>::const_iterator ti =
    std::find_if(this->GeneratorTargets.begin(), this->GeneratorTargets.end(),
                 NamedGeneratorTargetFinder(name));
  if (ti != this->GeneratorTargets.end()) {
    return *ti;
  }
  return CM_NULLPTR;
}